

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzarc3d.h
# Opt level: O1

void __thiscall
pzgeom::TPZArc3D::X<double>
          (TPZArc3D *this,TPZFMatrix<double> *coord,TPZVec<double> *loc,TPZVec<double> *result)

{
  double dVar1;
  double *pdVar2;
  int i;
  long lVar3;
  long lVar4;
  int j;
  long lVar5;
  bool bVar6;
  double dVar7;
  TPZFNMatrix<4,_double> RotMatrix;
  TPZManVector<double,_3> MappedBASE2D;
  double local_148;
  TPZFMatrix<double> local_120;
  double local_90 [5];
  TPZManVector<double,_3> local_68;
  
  local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector(&local_68,3,(double *)&local_120);
  local_120.fElem = local_90;
  local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
  local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 2;
  local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018a08f0;
  local_120.fSize = 4;
  local_120.fGiven = local_120.fElem;
  TPZVec<int>::TPZVec(&local_120.fPivot.super_TPZVec<int>,0);
  local_120.fPivot.super_TPZVec<int>.fStore = local_120.fPivot.fExtAlloc;
  local_120.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_120.fPivot.super_TPZVec<int>.fNElements = 0;
  local_120.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_120.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_120.fWork.fStore = (double *)0x0;
  local_120.fWork.fNElements = 0;
  local_120.fWork.fNAlloc = 0;
  local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018a0600;
  dVar7 = this->fRadius;
  dVar7 = ((*loc->fStore + 1.0) * this->fAngle * dVar7) / (dVar7 + dVar7);
  dVar1 = cos(dVar7);
  if ((local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
     (local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *local_120.fElem = dVar1;
  dVar1 = sin(dVar7);
  if ((local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
     (local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_120.fElem[local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow] = dVar1;
  dVar1 = sin(dVar7);
  if ((local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
     (local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_120.fElem[1] = -dVar1;
  dVar7 = cos(dVar7);
  if ((1 < local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow) &&
     (1 < local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol)) {
    local_120.fElem[local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + 1] = dVar7;
    lVar3 = 0;
    do {
      local_148 = 0.0;
      lVar5 = 0;
      do {
        if ((local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar3) ||
           (local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar5)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_148 = local_148 +
                    local_120.fElem
                    [local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar5 + lVar3] *
                    (this->finitialVector).super_TPZVec<double>.fStore[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 == 1);
      local_68.super_TPZVec<double>.fStore[lVar3] =
           local_148 +
           (double)(1 - (int)lVar3) * this->fXcenter + (double)(int)lVar3 * this->fYcenter;
      bVar6 = lVar3 != 0;
      lVar3 = lVar3 + 1;
      if (bVar6) {
        local_68.super_TPZVec<double>.fStore[2] = 0.0;
        lVar5 = 0;
        lVar3 = 0;
        while( true ) {
          pdVar2 = (double *)((long)(this->fIBaseCn).super_TPZFMatrix<double>.fElem + lVar5);
          dVar7 = 0.0;
          lVar4 = 0;
          do {
            dVar7 = dVar7 + *pdVar2 * local_68.super_TPZVec<double>.fStore[lVar4];
            lVar4 = lVar4 + 1;
            pdVar2 = pdVar2 + (this->fIBaseCn).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                              super_TPZBaseMatrix.fRow;
          } while (lVar4 != 3);
          if (((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar3) ||
             ((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) break;
          result->fStore[lVar3] =
               dVar7 + coord->fElem
                       [(coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 2 + lVar3];
          lVar3 = lVar3 + 1;
          lVar5 = lVar5 + 8;
          if (lVar3 == 3) {
            TPZFMatrix<double>::~TPZFMatrix(&local_120,&PTR_PTR_018a08b8);
            TPZManVector<double,_3>::~TPZManVector(&local_68);
            return;
          }
        }
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
    } while( true );
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void X(TPZFMatrix<REAL> &coord,TPZVec<T> &loc,TPZVec<T> &result) const
        {
            /** Computing initialVector = (iniR2 - CenterR2) */
            TPZManVector<T,3> MappedBASE2D(3,0.);
            
            TPZFNMatrix<4,T> RotMatrix(2,2);
            T deflection = fAngle * fRadius * (loc[0] + 1.) / (2.*fRadius);
            RotMatrix(0,0) =  cos(deflection); RotMatrix(0,1) = sin(deflection);
            RotMatrix(1,0) = -sin(deflection); RotMatrix(1,1) = cos(deflection);
            
            /** MappedPoint_R2 = centerCoord + vectorRotated , where Vx = RotationMatrix . Va */
            T centerCoord, vectRotated = 0.;
            for(int i = 0; i < 2; i++)
            {
                vectRotated = 0.;
                for(int j = 0; j < 2; j++) vectRotated += RotMatrix(i,j)*finitialVector[j];
                centerCoord = (1-i)*fXcenter + i*fYcenter;
                MappedBASE2D[i] = centerCoord + vectRotated;
            }
            
            /** Changing Basis of Obtained MappedPoint from R2 to R3 */
            MappedBASE2D[2] = 0.;
            for(int i = 0; i < 3; i++)
            {
                vectRotated = 0.;
                for(int j = 0; j < 3; j++)
                {
                    vectRotated += fIBaseCn.GetVal(i,j)*MappedBASE2D[j];
                }
                result[i] = vectRotated + coord(i,2);
            }

        }